

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
::
_multiply_target_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>
          (Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>
           *this,Field_element *val,
          Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
          *column)

{
  pointer ppEVar1;
  pointer ppEVar2;
  bool bVar3;
  Index position;
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
  *__range4;
  pointer ppEVar4;
  _Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
  local_88;
  anon_class_8_1_d68037b6 local_68;
  anon_class_16_2_633bb64e local_60;
  anon_class_16_2_90bf7f7f local_50;
  anon_class_24_3_e26cf068 local_40;
  
  if (*val == 0) {
    Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
    ::clear((Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
             *)this);
  }
  if (*(long *)(this + 0x10) == *(long *)(this + 0x18)) {
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
    ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
              *)(this + 0x10),
             ((long)(column->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(column->column_).
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) -
             (column->erasedValues_)._M_h._M_element_count);
    ppEVar1 = (column->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    position = 0;
    for (ppEVar4 = (column->column_).
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar4 != ppEVar1;
        ppEVar4 = ppEVar4 + 1) {
      Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
      ::_update_entry((Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
                       *)this,&((*ppEVar4)->super_Entry_field_element_option).element_,
                      (*ppEVar4)->rowIndex_,position);
      position = position + 1;
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::operator=((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(this + 0x28),&(column->erasedValues_)._M_h);
    bVar3 = true;
  }
  else {
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
    ::reserve((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
               *)&local_88,
              ((*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3) -
              (column->erasedValues_)._M_h._M_element_count) +
              ((long)(column->column_).
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(column->column_).
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    local_68.newColumn = (Column_support *)&local_88;
    local_60.this =
         (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
          *)this;
    local_60.val = val;
    local_50.newColumn = (Column_support *)&local_88;
    local_50.this =
         (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
          *)this;
    local_40.this =
         (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>
          *)this;
    local_40.val = val;
    local_40.newColumn = (Column_support *)&local_88;
    bVar3 = _generic_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>::_multiply_target_and_add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>>(unsigned_int_const&,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>*)_1_,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>::_multiply_target_and_add<Gudhi::persistence_matrix___i_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,false>>>*)_2_>
                      (this,column,&local_40,&local_50,&local_60,&local_68);
    ppEVar4 = *(pointer *)(this + 0x20);
    *(pointer *)(this + 0x20) = local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppEVar1 = *(pointer *)(this + 0x10);
    ppEVar2 = *(pointer *)(this + 0x18);
    *(pointer *)(this + 0x10) = local_88._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x18) = local_88._M_impl.super__Vector_impl_data._M_finish;
    local_88._M_impl.super__Vector_impl_data._M_start = ppEVar1;
    local_88._M_impl.super__Vector_impl_data._M_finish = ppEVar2;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar4;
    std::
    _Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_false>_>_>_*>_>
    ::~_Vector_base(&local_88);
  }
  return bVar3;
}

Assistant:

inline bool Vector_column<Master_matrix>::_multiply_target_and_add(const Field_element& val, const Entry_range& column)
{
  if (val == 0u) {
    if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      clear();
    }
  }
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        _update_entry(entry.get_row_index(), i++);
      } else {
        _update_entry(entry.get_element(), entry.get_row_index(), i++);
      }
    }
    if constexpr (std::is_same_v<Entry_range, Vector_column<Master_matrix> >) erasedValues_ = column.erasedValues_;
    return true;
  }

  Column_support newColumn;
  newColumn.reserve(column_.size() + column.size());  // safe upper bound

  auto pivotIsZeroed = _generic_add(
      column,
      [&](Entry* entryTarget) {
        operators_->multiply_inplace(entryTarget->get_element(), val);
        if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*entryTarget);
        newColumn.push_back(entryTarget);
      },
      [&](typename Entry_range::const_iterator& itSource, const typename Column_support::iterator& itTarget) {
        _insert_entry(itSource->get_element(), itSource->get_row_index(), newColumn);
      },
      [&](Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        operators_->multiply_and_add_inplace_front(targetElement, val, itSource->get_element());
      },
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); }
    );

  column_.swap(newColumn);

  return pivotIsZeroed;
}